

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

void __thiscall
CFG::anon_unknown_11::Optimizer::MergeBranchInto(Optimizer *this,Branch *Curr,Branch *Into)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  Expression *right;
  bool bVar2;
  Binary *pBVar3;
  Builder local_20;
  
  if (Curr == Into) {
    __assert_fail("Curr != Into",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                  ,0x3cc,
                  "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)")
    ;
  }
  pvVar1 = (Curr->SwitchValues)._M_t.
           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
           ._M_head_impl;
  if (pvVar1 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    if (Curr->Condition == (Expression *)0x0) {
      Into->Condition = (Expression *)0x0;
      std::
      __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::reset((__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&Into->SwitchValues,(pointer)0x0);
    }
    else if (Into->Condition != (Expression *)0x0) {
      if ((Into->SwitchValues)._M_t.
          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        __assert_fail("!Into->SwitchValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                      ,0x3df,
                      "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)"
                     );
      }
      local_20.wasm = ((this->super_RelooperRecursor).Parent)->Module;
      pBVar3 = ::wasm::Builder::makeBinary(&local_20,OrInt32,Into->Condition,Curr->Condition);
      Into->Condition = (Expression *)pBVar3;
    }
  }
  else {
    this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
              (Into->SwitchValues)._M_t.
              super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl;
    if (this_00 == (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0) {
      if (Into->Condition != (Expression *)0x0) {
        __assert_fail("!Into->Condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                      ,0x3cf,
                      "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)"
                     );
      }
    }
    else {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                (this_00,(const_iterator)*(uint **)(this_00 + 8),
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )*(uint **)&(pvVar1->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )*(pointer *)
                    ((long)&(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl + 8));
    }
  }
  right = Curr->Code;
  if (right != (Expression *)0x0) {
    if (Into->Code == (Expression *)0x0) {
      Into->Code = right;
    }
    else {
      bVar2 = ::wasm::ExpressionAnalyzer::equal(Into->Code,right);
      if (!bVar2) {
        __assert_fail("IsCodeEquivalent(Into->Code, Curr->Code)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                      ,0x3ec,
                      "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)"
                     );
      }
    }
  }
  return;
}

Assistant:

void MergeBranchInto(Branch* Curr, Branch* Into) {
    assert(Curr != Into);
    if (Curr->SwitchValues) {
      if (!Into->SwitchValues) {
        assert(!Into->Condition);
        // Merging into the already-default, nothing to do.
      } else {
        Into->SwitchValues->insert(Into->SwitchValues->end(),
                                   Curr->SwitchValues->begin(),
                                   Curr->SwitchValues->end());
      }
    } else {
      if (!Curr->Condition) {
        // This is now the new default. Whether Into has a condition
        // or switch values, remove them all to make us the default.
        Into->Condition = nullptr;
        Into->SwitchValues.reset();
      } else if (!Into->Condition) {
        // Nothing to do, already the default.
      } else {
        assert(!Into->SwitchValues);
        // Merge them, checking both.
        Into->Condition =
          wasm::Builder(*Parent->Module)
            .makeBinary(wasm::OrInt32, Into->Condition, Curr->Condition);
      }
    }
    if (!Curr->Code) {
      // No code to merge in.
    } else if (!Into->Code) {
      // Just use the code being merged in.
      Into->Code = Curr->Code;
    } else {
      assert(IsCodeEquivalent(Into->Code, Curr->Code));
      // Keep the code already there, either is fine.
    }
  }